

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::operator*(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  uint c;
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer p_Var4;
  long lVar5;
  pointer p_Var6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong *puVar34;
  ulong uVar35;
  ulong *puVar36;
  ulong *puVar37;
  bool bVar38;
  long local_78;
  
  c = a->c;
  Mat(__return_storage_ptr__,this->r,c);
  uVar1 = this->r;
  lVar32 = (long)(int)uVar1;
  local_78 = 0;
  uVar19 = 0;
  if (0 < (int)uVar1) {
    uVar19 = (ulong)uVar1;
  }
  uVar20 = 0;
  if (0 < (int)c) {
    uVar20 = (ulong)c;
  }
  for (uVar26 = 0; uVar26 != uVar20; uVar26 = uVar26 + 1) {
    iVar2 = this->order;
    iVar3 = a->order;
    uVar1 = this->c;
    lVar25 = uVar26 * lVar32;
    uVar30 = 0;
    if (0 < (int)uVar1) {
      uVar30 = (ulong)uVar1;
    }
    lVar31 = uVar30 * 0x10;
    lVar21 = local_78 * (int)uVar1;
    lVar28 = 0;
    lVar27 = 0;
    for (uVar33 = 0; uVar33 != uVar19; uVar33 = uVar33 + 1) {
      switch(iVar2 * 2 + iVar3) {
      case 0:
        puVar36 = (ulong *)((__return_storage_ptr__->val).
                            super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar25 + uVar33);
        p_Var6 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar34 = (ulong *)((long)(this->val).
                                  super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar28);
        for (lVar29 = 0; lVar31 != lVar29; lVar29 = lVar29 + 0x10) {
          uVar7 = *puVar34;
          uVar8 = *(ulong *)((long)p_Var6 + lVar29 + lVar21);
          lVar9 = *(long *)((long)p_Var6 + lVar29 + lVar21 + 8);
          uVar22 = puVar34[1];
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar8;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar7;
          uVar23 = SUB168(auVar11 * auVar15,0);
          uVar35 = *puVar36;
          *puVar36 = *puVar36 + uVar23;
          puVar36[1] = puVar36[1] + SUB168(auVar11 * auVar15,8) + uVar22 * uVar8 + lVar9 * uVar7 +
                       (ulong)CARRY8(uVar35,uVar23);
          puVar34 = puVar34 + lVar32 * 2;
        }
        break;
      case 1:
        puVar34 = (ulong *)((__return_storage_ptr__->val).
                            super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar25 + uVar33);
        puVar36 = (ulong *)((long)(this->val).
                                  super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar28);
        puVar37 = (ulong *)((long)(a->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start + local_78);
        uVar35 = uVar30;
        while (bVar38 = uVar35 != 0, uVar35 = uVar35 - 1, bVar38) {
          uVar8 = *puVar36;
          uVar22 = *puVar37;
          uVar23 = puVar36[1];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar22;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar8;
          uVar24 = SUB168(auVar14 * auVar18,0);
          uVar10 = puVar37[1];
          uVar7 = *puVar34;
          *puVar34 = *puVar34 + uVar24;
          puVar34[1] = puVar34[1] + uVar8 * uVar10 + SUB168(auVar14 * auVar18,8) + uVar23 * uVar22 +
                       (ulong)CARRY8(uVar7,uVar24);
          puVar36 = puVar36 + lVar32 * 2;
          puVar37 = puVar37 + (long)(int)c * 2;
        }
        break;
      case 2:
        puVar34 = (ulong *)((__return_storage_ptr__->val).
                            super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar25 + uVar33);
        p_Var6 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        p_Var4 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar29 = 0; lVar31 != lVar29; lVar29 = lVar29 + 0x10) {
          uVar7 = *(ulong *)((long)p_Var4 + lVar29 + lVar27);
          uVar8 = *(ulong *)((long)p_Var6 + lVar29 + lVar21);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar8;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = uVar7;
          uVar22 = SUB168(auVar12 * auVar16,0);
          lVar9 = *(long *)((long)p_Var4 + lVar29 + lVar27 + 8);
          lVar5 = *(long *)((long)p_Var6 + lVar29 + lVar21 + 8);
          uVar35 = *puVar34;
          *puVar34 = *puVar34 + uVar22;
          puVar34[1] = puVar34[1] + uVar7 * lVar5 + uVar8 * lVar9 + SUB168(auVar12 * auVar16,8) +
                       (ulong)CARRY8(uVar35,uVar22);
        }
        break;
      case 3:
        puVar34 = (ulong *)((__return_storage_ptr__->val).
                            super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar25 + uVar33);
        p_Var6 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar36 = (ulong *)((long)(a->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
                                  _M_impl.super__Vector_impl_data._M_start + local_78);
        for (lVar29 = 0; lVar31 != lVar29; lVar29 = lVar29 + 0x10) {
          uVar7 = *(ulong *)((long)p_Var6 + lVar29 + lVar27);
          uVar8 = *puVar36;
          lVar9 = *(long *)((long)p_Var6 + lVar29 + lVar27 + 8);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar8;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar7;
          uVar23 = SUB168(auVar13 * auVar17,0);
          uVar22 = puVar36[1];
          uVar35 = *puVar34;
          *puVar34 = *puVar34 + uVar23;
          puVar34[1] = puVar34[1] + uVar7 * uVar22 + SUB168(auVar13 * auVar17,8) + lVar9 * uVar8 +
                       (ulong)CARRY8(uVar35,uVar23);
          puVar36 = puVar36 + (long)(int)c * 2;
        }
      }
      lVar27 = lVar27 + (long)(int)uVar1 * 0x10;
      lVar28 = lVar28 + 0x10;
    }
    local_78 = local_78 + 0x10;
  }
  residual(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator*(const Mat &a) {
    int tmp_c;
    tmp_c = a.cols();
    Mat ret(r, a.cols());
    int i, j;
    for (int j = 0; j < tmp_c; j++) {
        for (int i = 0; i < r; i++) {
            switch (pair_order_type(this, &a)) {
                case MM_NN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[j * c + k];
                    }
                    break;
                case MM_NT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[k * tmp_c + j];
                    }
                    break;
                case MM_TN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[j * c + k];
                    }
                    break;
                case MM_TT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[k * tmp_c + j];
                    }
                    break;
            }
        }
    }
    ret.residual();
    return ret;
}